

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove.c
# Opt level: O2

int main(void)

{
  uint __line;
  ll_elem *plVar1;
  obj *poVar2;
  obj *poVar3;
  obj *poVar4;
  long lVar5;
  int iVar6;
  obj *in_RSI;
  objlist *in_RDI;
  objlist *q;
  char *__assertion;
  
  poVar2 = data;
  for (lVar5 = 0; plVar1 = &poVar2->entry, lVar5 != 1000; lVar5 = lVar5 + 1) {
    *(int *)((long)(plVar1 + -1) + 0x10) = (int)lVar5;
    plVar1->succ = 0;
    plVar1->pred = 0;
    plVar1->refcnt = 0;
    poVar2 = (obj *)(plVar1 + 1);
  }
  for (lVar5 = 8; lVar5 != 0x7d08; lVar5 = lVar5 + 0x20) {
    in_RSI = (obj *)((long)&data[0].satelite + lVar5);
    in_RDI = &list;
    ll_insert_tail(&list.ll_head,(ll_elem *)in_RSI,0);
  }
  poVar2 = ll_first_objlist(in_RDI);
  for (iVar6 = 0; iVar6 != 1000; iVar6 = iVar6 + 1) {
    if (poVar2 == (obj *)0x0) {
      __assertion = "o != NULL";
      __line = 0x17;
      goto LAB_001012ba;
    }
    if (iVar6 != poVar2->satelite) {
      __assertion = "o->satelite == i";
      __line = 0x18;
      goto LAB_001012ba;
    }
    poVar3 = ll_succ_objlist((objlist *)poVar2,in_RSI);
    in_RSI = (obj *)&poVar2->entry;
    ll_release(&list.ll_head,(ll_elem *)in_RSI);
    poVar2 = poVar3;
  }
  ll_ref(&list.ll_head,&data[0].entry);
  iVar6 = 1;
  q = &list;
  poVar3 = (obj *)&data[0].entry;
  ll_unlink(&list.ll_head,&data[0].entry,1);
  poVar2 = ll_first_objlist(q);
  while( true ) {
    if (iVar6 == 1000) {
      return 0;
    }
    if (poVar2 == (obj *)0x0) break;
    if (iVar6 != poVar2->satelite) {
      __assertion = "o->satelite == i";
      __line = 0x25;
      goto LAB_001012ba;
    }
    poVar4 = ll_succ_objlist((objlist *)poVar2,poVar3);
    poVar3 = (obj *)&poVar2->entry;
    ll_release(&list.ll_head,(ll_elem *)poVar3);
    iVar6 = iVar6 + 1;
    poVar2 = poVar4;
  }
  __assertion = "o != NULL";
  __line = 0x24;
LAB_001012ba:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/test/remove.c",
                __line,"int main()");
}

Assistant:

int
main()
{
	int i;
	struct obj *o, *next_o = NULL;

	for (i = 0; i < N; i++) {
		data[i].satelite = i;
		LL_INIT_ENTRY(&data[i].entry);
	}

	for (i = 0; i < N; i++)
		LL_PUSH_BACK(objlist, &list, &data[i]);

	for (i = 0, o = LL_FIRST(objlist, &list);
	    i < N;
	    i++, o = next_o) {
		assert(o != NULL);
		assert(o->satelite == i);

		next_o = LL_NEXT(objlist, &list, o);

		LL_RELEASE(objlist, &list, o);
	}

	LL_REF(objlist, &list, &data[0]);
	LL_UNLINK(objlist, &list, &data[0]);
	for (i = 1, o = LL_FIRST(objlist, &list);
	    i < N;
	    i++, o = next_o) {
		assert(o != NULL);
		assert(o->satelite == i);

		next_o = LL_NEXT(objlist, &list, o);

		LL_RELEASE(objlist, &list, o);
	}

	return 0;
}